

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ExprAnd(Fts5Expr **pp1,Fts5Expr *p2)

{
  uint uVar1;
  Fts5Expr *pFVar2;
  int iVar3;
  Fts5ExprNode *pFVar4;
  Fts5ExprPhrase **ppFVar5;
  long lVar6;
  int iVar7;
  u64 nBytes;
  int iVar8;
  Fts5Expr *p1;
  long in_FS_OFFSET;
  Fts5Parse local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.pExpr = (Fts5ExprNode *)0x0;
  local_68.bPhraseToAnd = 0;
  local_68._44_4_ = 0;
  local_68.rc = 0;
  local_68.nPhrase = 0;
  local_68.apPhrase = (Fts5ExprPhrase **)0x0;
  local_68.pConfig = (Fts5Config *)0x0;
  local_68.zErr = (char *)0x0;
  pFVar2 = *pp1;
  if (p2 == (Fts5Expr *)0x0 || pFVar2 == (Fts5Expr *)0x0) {
    iVar7 = 0;
    if (p2 != (Fts5Expr *)0x0) {
      *pp1 = p2;
    }
  }
  else {
    iVar8 = p2->nPhrase + pFVar2->nPhrase;
    pFVar4 = sqlite3Fts5ParseNode(&local_68,2,pFVar2->pRoot,p2->pRoot,(Fts5ExprNearset *)0x0);
    pFVar2->pRoot = pFVar4;
    p2->pRoot = (Fts5ExprNode *)0x0;
    iVar7 = local_68.rc;
    if (local_68.rc == 0) {
      ppFVar5 = pFVar2->apExprPhrase;
      iVar3 = sqlite3_initialize();
      iVar7 = 7;
      if (iVar3 == 0) {
        uVar1 = iVar8 * 8;
        nBytes = 0;
        if (0 < (int)uVar1) {
          nBytes = (u64)uVar1;
        }
        ppFVar5 = (Fts5ExprPhrase **)sqlite3Realloc(ppFVar5,nBytes);
        if (ppFVar5 != (Fts5ExprPhrase **)0x0) {
          memmove(ppFVar5 + p2->nPhrase,ppFVar5,(long)pFVar2->nPhrase << 3);
          iVar7 = p2->nPhrase;
          if (0 < (long)iVar7) {
            lVar6 = 0;
            do {
              ppFVar5[lVar6] = p2->apExprPhrase[lVar6];
              lVar6 = lVar6 + 1;
            } while (iVar7 != lVar6);
          }
          pFVar2->nPhrase = iVar8;
          pFVar2->apExprPhrase = ppFVar5;
          iVar7 = 0;
        }
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5ExprAnd(Fts5Expr **pp1, Fts5Expr *p2){
  Fts5Parse sParse;
  memset(&sParse, 0, sizeof(sParse));

  if( *pp1 && p2 ){
    Fts5Expr *p1 = *pp1;
    int nPhrase = p1->nPhrase + p2->nPhrase;

    p1->pRoot = sqlite3Fts5ParseNode(&sParse, FTS5_AND, p1->pRoot, p2->pRoot,0);
    p2->pRoot = 0;

    if( sParse.rc==SQLITE_OK ){
      Fts5ExprPhrase **ap = (Fts5ExprPhrase**)sqlite3_realloc(
          p1->apExprPhrase, nPhrase * sizeof(Fts5ExprPhrase*)
      );
      if( ap==0 ){
        sParse.rc = SQLITE_NOMEM;
      }else{
        int i;
        memmove(&ap[p2->nPhrase], ap, p1->nPhrase*sizeof(Fts5ExprPhrase*));
        for(i=0; i<p2->nPhrase; i++){
          ap[i] = p2->apExprPhrase[i];
        }
        p1->nPhrase = nPhrase;
        p1->apExprPhrase = ap;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }else if( p2 ){
    *pp1 = p2;
  }

  return sParse.rc;
}